

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void __thiscall mp::Error::Error(Error *this,CStringRef msg,int c)

{
  Error *this_00;
  undefined4 in_EDX;
  string *in_RDI;
  RuntimeError *in_stack_ffffffffffffffa0;
  allocator<char> local_45 [13];
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  BasicCStringRef<char> local_8;
  
  fmt::internal::RuntimeError::RuntimeError(in_stack_ffffffffffffffa0);
  *(undefined ***)in_RDI = &PTR__Error_001a2ae8;
  *(undefined4 *)&in_RDI->field_2 = in_EDX;
  this_00 = (Error *)fmt::BasicCStringRef<char>::c_str(&local_8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  SetMessage(this_00,in_RDI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(local_45);
  return;
}

Assistant:

Error(fmt::CStringRef msg, int c=-1) : exit_code_(c)
  { SetMessage(msg.c_str()); }